

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,string *file)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  MatchRule *mr;
  pointer this_00;
  
  this_00 = (this->MatchRules).
            super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->MatchRules).
           super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  if (this_00 == pMVar1) {
    bVar5 = 0;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar5 = 0;
    do {
      bVar2 = cmsys::RegularExpression::find
                        (&this_00->Regex,(file->_M_dataplus)._M_p,(RegularExpressionMatch *)this_00)
      ;
      if (bVar2) {
        bVar5 = bVar5 | (this_00->Properties).Exclude;
        uVar4 = (ulong)((uint)uVar4 | (this_00->Properties).Permissions);
        bVar3 = true;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pMVar1);
    uVar4 = uVar4 << 0x20;
  }
  if ((!bVar3) && (this->MatchlessFiles == false)) {
    bVar3 = cmsys::SystemTools::FileIsDirectory(file);
    bVar5 = !bVar3;
  }
  return (MatchProperties)(uVar4 | bVar5);
}

Assistant:

cmFileCopier::MatchProperties cmFileCopier::CollectMatchProperties(
  const std::string& file)
{
  // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
  const std::string file_to_match = cmSystemTools::LowerCase(file);
#else
  const std::string& file_to_match = file;
#endif

  // Collect properties from all matching rules.
  bool matched = false;
  MatchProperties result;
  for (MatchRule& mr : this->MatchRules) {
    if (mr.Regex.find(file_to_match)) {
      matched = true;
      result.Exclude |= mr.Properties.Exclude;
      result.Permissions |= mr.Properties.Permissions;
    }
  }
  if (!matched && !this->MatchlessFiles) {
    result.Exclude = !cmSystemTools::FileIsDirectory(file);
  }
  return result;
}